

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O1

QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> * __thiscall
QAccessibleGroupBox::relations
          (QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
           *__return_storage_ptr__,QAccessibleGroupBox *this,Relation match)

{
  QWidget **ppQVar1;
  QWidget *pQVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QAccessibleInterface *iface;
  QFlagsStorage<QAccessible::RelationFlag> local_74;
  QAccessibleInterface *local_70;
  QWidgetList local_68;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr =
       (pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *)&DAT_aaaaaaaaaaaaaaaa;
  QAccessibleWidget::relations(__return_storage_ptr__,&this->super_QAccessibleWidget,match);
  if (((uint)match.super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>.
             super_QFlagsStorage<QAccessible::RelationFlag>.i & 2) == 0) {
    bVar5 = false;
  }
  else {
    pQVar2 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
    QGroupBox::title(&local_50,(QGroupBox *)pQVar2);
    bVar5 = local_50.d.size != 0;
  }
  if ((((uint)match.super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>.
              super_QFlagsStorage<QAccessible::RelationFlag>.i & 2) != 0) &&
     (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar5) {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
    _q_ac_childWidgets(&local_68,pQVar2);
    ppQVar1 = local_68.d.ptr;
    if ((undefined1 *)local_68.d.size != (undefined1 *)0x0) {
      lVar4 = local_68.d.size << 3;
      lVar3 = 0;
      do {
        local_70 = (QAccessibleInterface *)
                   QAccessible::queryAccessibleInterface(*(QObject **)((long)ppQVar1 + lVar3));
        if (local_70 != (QAccessibleInterface *)0x0) {
          local_74.i = 2;
          QtPrivate::
          QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
          emplace<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>>
                    ((QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>
                      *)__return_storage_ptr__,(__return_storage_ptr__->d).size,&local_70,
                     (QFlags<QAccessible::RelationFlag> *)&local_74);
          QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::end
                    (__return_storage_ptr__);
        }
        lVar3 = lVar3 + 8;
      } while (lVar4 != lVar3);
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<std::pair<QAccessibleInterface *, QAccessible::Relation>>
QAccessibleGroupBox::relations(QAccessible::Relation match /* = QAccessible::AllRelations */) const
{
    QList<std::pair<QAccessibleInterface *, QAccessible::Relation>> rels =
            QAccessibleWidget::relations(match);

    if ((match & QAccessible::Labelled) && (!groupBox()->title().isEmpty())) {
        const QList<QWidget*> kids = _q_ac_childWidgets(widget());
        for (QWidget *kid : kids) {
            QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(kid);
            if (iface)
                rels.emplace_back(iface, QAccessible::Relation(QAccessible::Labelled));
        }
    }
    return rels;
}